

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GatherLayerParams::SerializeWithCachedSizes
          (GatherLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
    return;
  }
  return;
}

Assistant:

void GatherLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GatherLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GatherLayerParams)
}